

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cpp
# Opt level: O1

bool __thiscall
Tokenizer::tokenize_symbol(Tokenizer *this,char character,string *token,string *meta_string)

{
  ulong uVar1;
  char *pcVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  char next_char;
  char local_61;
  value_type local_50;
  
  auVar4 = std::istream::tellg();
  std::istream::get((char *)this->file_stream);
  std::istream::seekg(this->file_stream,auVar4._0_8_,auVar4._8_8_);
  if ((((character != '/') || (local_61 != '/' && local_61 != '*')) &&
      ((uVar1 = token->_M_string_length, uVar1 < 2 ||
       ((pcVar2 = (token->_M_dataplus)._M_p, *pcVar2 != '/' || (pcVar2[1] != '*')))))) &&
     ((character != '*' || (*(token->_M_dataplus)._M_p != '/')))) {
    if (uVar1 == 0) {
      if (character == '\"') {
        return false;
      }
      if (meta_string->_M_string_length != 0) {
        return false;
      }
    }
    pcVar2 = (token->_M_dataplus)._M_p;
    bVar3 = *pcVar2 == '/';
    if (bVar3 && character != '/') {
      bVar3 = pcVar2[1] == '/';
    }
    if (!bVar3) {
      if (uVar1 != 0) {
        std::
        deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&(this->token_queue).c,token);
        std::__cxx11::string::_M_replace((ulong)token,0,(char *)token->_M_string_length,0x1332e5);
      }
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::push_back((char)&local_50);
      std::
      deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&(this->token_queue).c,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,
                        CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                                 local_50.field_2._M_local_buf[0]) + 1);
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool Tokenizer::tokenize_symbol(char character, std::string& token, const std::string& meta_string) {
    char next_char;
    std::streampos cur_pos = save_file_position();
    file_stream.get(next_char);

    if (character == '/' && next_char == '/' || character == '/' && next_char == '*') {
        file_stream.seekg(cur_pos);
        return false;
    }
    file_stream.seekg(cur_pos);

    if (!is_multiline_comment(character, token) &&
            !is_string(character, meta_string, token) && !is_singleline_comment(character, token))  {

        if (!token.empty()){
            token_queue.push(token);
            token = "";
        }
        token_queue.push(std::string() += character);
        return true;
    }
    return false;
}